

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_mp3_seek_to_pcm_frame(ma_dr_mp3 *pMP3,ma_uint64 frameIndex)

{
  ulong *puVar1;
  ma_dr_mp3_seek_proc p_Var2;
  ma_dr_mp3_seek_point *pmVar3;
  ma_bool32 mVar4;
  ma_uint32 mVar5;
  ulong uVar6;
  long lVar7;
  ma_uint8 *pPCMFrames;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ma_uint64 local_40;
  ulong local_38;
  
  if (pMP3 == (ma_dr_mp3 *)0x0) {
    return 0;
  }
  p_Var2 = pMP3->onSeek;
  if (p_Var2 == (ma_dr_mp3_seek_proc)0x0) {
    return 0;
  }
  if (frameIndex == 0) {
    mVar4 = ma_dr_mp3_seek_to_start_of_stream(pMP3);
    return mVar4;
  }
  pmVar3 = pMP3->pSeekPoints;
  if ((pmVar3 == (ma_dr_mp3_seek_point *)0x0) || ((ulong)pMP3->seekPointCount == 0)) {
    local_38 = pMP3->currentPCMFrame;
    if (local_38 == frameIndex) {
      return 1;
    }
    if (frameIndex < local_38) {
      mVar4 = ma_dr_mp3_seek_to_start_of_stream(pMP3);
      if (mVar4 == 0) {
        return 0;
      }
      local_38 = pMP3->currentPCMFrame;
    }
    goto LAB_0014e1ab;
  }
  if (frameIndex < pmVar3->pcmFrameIndex) {
    local_38 = 0;
    uVar9 = 0;
    local_40 = 0;
    uVar10 = 0;
LAB_0014e142:
    mVar4 = (*p_Var2)(pMP3->pUserData,(int)uVar9,ma_dr_mp3_seek_origin_start);
    if (mVar4 == 0) {
      return 0;
    }
    pMP3->streamCursor = uVar9;
  }
  else {
    lVar7 = 0;
    uVar9 = 0;
    uVar8 = 0;
    do {
      uVar6 = uVar8;
      uVar8 = uVar9;
      if ((ulong)pMP3->seekPointCount * 0x18 + 0x18 == lVar7 + 0x18) break;
      puVar1 = (ulong *)((long)&pmVar3->pcmFrameIndex + lVar7);
      lVar7 = lVar7 + 0x18;
      uVar9 = uVar8 + 1;
    } while (*puVar1 <= frameIndex);
    uVar6 = uVar6 & 0xffffffff;
    uVar9 = pmVar3[uVar6].seekPosInBytes;
    local_40 = pmVar3[uVar6].pcmFrameIndex;
    uVar10 = (uint)pmVar3[uVar6].mp3FramesToDiscard;
    local_38 = (ulong)pmVar3[uVar6].pcmFramesToDiscard;
    if (uVar9 < 0x80000000) goto LAB_0014e142;
    mVar4 = (*p_Var2)(pMP3->pUserData,0x7fffffff,ma_dr_mp3_seek_origin_start);
    if (mVar4 == 0) {
      return 0;
    }
    pMP3->streamCursor = 0x7fffffff;
    uVar9 = uVar9 - 0x7fffffff;
    while (uVar9 != 0) {
      if (uVar9 < 0x80000000) {
        mVar4 = ma_dr_mp3__on_seek(pMP3,(int)uVar9,ma_dr_mp3_seek_origin_current);
        uVar9 = 0;
        if (mVar4 == 0) {
          return 0;
        }
      }
      else {
        mVar4 = ma_dr_mp3__on_seek(pMP3,0x7fffffff,ma_dr_mp3_seek_origin_current);
        if (mVar4 == 0) {
          return 0;
        }
        uVar9 = uVar9 - 0x7fffffff;
      }
    }
  }
  ma_dr_mp3_reset(pMP3);
  while (uVar10 != 0) {
    pPCMFrames = (ma_uint8 *)0x0;
    if (uVar10 == 1) {
      pPCMFrames = pMP3->pcmFrames;
    }
    mVar5 = ma_dr_mp3_decode_next_frame_ex(pMP3,(ma_dr_mp3d_sample_t *)pPCMFrames);
    uVar10 = uVar10 - 1;
    if (mVar5 == 0) {
      return 0;
    }
  }
  local_38 = local_40 - local_38;
  pMP3->currentPCMFrame = local_38;
LAB_0014e1ab:
  mVar4 = ma_dr_mp3_seek_forward_by_pcm_frames__brute_force(pMP3,frameIndex - local_38);
  return mVar4;
}

Assistant:

MA_API ma_bool32 ma_dr_mp3_seek_to_pcm_frame(ma_dr_mp3* pMP3, ma_uint64 frameIndex)
{
    if (pMP3 == NULL || pMP3->onSeek == NULL) {
        return MA_FALSE;
    }
    if (frameIndex == 0) {
        return ma_dr_mp3_seek_to_start_of_stream(pMP3);
    }
    if (pMP3->pSeekPoints != NULL && pMP3->seekPointCount > 0) {
        return ma_dr_mp3_seek_to_pcm_frame__seek_table(pMP3, frameIndex);
    } else {
        return ma_dr_mp3_seek_to_pcm_frame__brute_force(pMP3, frameIndex);
    }
}